

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

void chrono::utils::AddBoxGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,ChVector<double> *size,
               ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChBoxShape *this;
  ChBody *model;
  shared_ptr<chrono::ChBoxShape> box;
  shared_ptr<chrono::ChVisualShape> local_130;
  shared_ptr<chrono::ChVisualMaterial> local_120;
  ChBoxShape *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_100 [48];
  double local_d0;
  ChSystem *local_c8;
  element_type *local_c0;
  ChFrame<double> local_b8;
  
  peVar1 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_100._16_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_100._24_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count + 1;
    }
  }
  local_d0 = size->m_data[0];
  local_100._40_8_ = size->m_data[1];
  local_100._32_8_ = size->m_data[2];
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_b8,rot);
  (*peVar1->_vptr_ChCollisionModel[7])
            (local_d0,local_100._40_8_,local_100._32_8_,peVar1,local_100 + 0x10,pos,&local_b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0]);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._vptr_ChFrame ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
      local_100._0_8_ = p_Var2 + 1;
      p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[1]._M_use_count = 0;
      p_Var2[1]._M_weak_count = 0;
      p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[2]._M_use_count = 0;
      p_Var2[2]._M_weak_count = 0;
      p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[2]._M_use_count = 0;
      p_Var2[2]._M_weak_count = 0;
      p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[3]._M_use_count = 0;
      p_Var2[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = 2;
      }
      model = (ChBody *)local_100;
      local_100._8_8_ = p_Var2;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    this = (ChBoxShape *)ChVisualShape::operator_new((ChVisualShape *)0x48,(size_t)model);
    ChBoxShape::ChBoxShape(this);
    local_110 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBoxShape*>
              (&local_108,this);
    if (&(local_110->gbox).Size != size) {
      (local_110->gbox).Size.m_data[0] = size->m_data[0];
      (local_110->gbox).Size.m_data[1] = size->m_data[1];
      (local_110->gbox).Size.m_data[2] = size->m_data[2];
    }
    local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)
            ._M_refcount._M_pi;
    if (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial(&local_110->super_ChVisualShape,&local_120);
    if (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_110->super_ChVisualShape;
    local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_108._M_pi;
    if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
      }
    }
    local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_b8.coord.pos.m_data[0] = pos->m_data[0];
    local_b8.coord.pos.m_data[1] = pos->m_data[1];
    local_b8.coord.pos.m_data[2] = pos->m_data[2];
    local_b8.coord.rot.m_data[0] = rot->m_data[0];
    local_b8.coord.rot.m_data[1] = rot->m_data[1];
    local_b8.coord.rot.m_data[2] = rot->m_data[2];
    local_b8.coord.rot.m_data[3] = rot->m_data[3];
    ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,rot);
    ChVisualModel::AddShape((ChVisualModel *)local_c8,&local_130,&local_b8);
    if (local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_c0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0);
    }
    if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
    }
  }
  return;
}

Assistant:

void AddBoxGeometry(ChBody* body,
                    std::shared_ptr<ChMaterialSurface> material,
                    const ChVector<>& size,
                    const ChVector<>& pos,
                    const ChQuaternion<>& rot,
                    bool visualization,
                    std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddBox(material, size.x(), size.y(), size.z(), pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto box = chrono_types::make_shared<ChBoxShape>();
        box->GetBoxGeometry().Size = size;
        box->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(box, ChFrame<>(pos, rot));
    }
}